

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

wostream * Centaurus::operator<<(wostream *os,CharClass<unsigned_char> *cc)

{
  byte ch;
  byte bVar1;
  pointer pRVar2;
  
  pRVar2 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar2 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(os,L'[');
    for (; pRVar2 != (cc->m_ranges).
                     super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pRVar2 = pRVar2 + 1) {
      ch = pRVar2->m_start;
      bVar1 = pRVar2->m_end;
      printc(os,ch);
      if (ch + 1 != (uint)bVar1) {
        std::operator<<(os,L'-');
        printc(os,pRVar2->m_end + 0xff);
      }
    }
    std::operator<<(os,L']');
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const CharClass<TCHAR>& cc)
{
    if (cc.is_epsilon()) return os;

    auto i = cc.m_ranges.cbegin();

	os << L'[';
    for (; i != cc.m_ranges.cend();)
    {
        if (i->end() == i->start() + 1)
        {
            /*if (i->start() == wide_to_target<TCHAR>(L'"'))
                os << L"\\\"";
            else if (i->start() == wide_to_target<TCHAR>(L'\\'))
                os << L"\\\\";
            else
            {
                wchar_t ch = os.widen(i->start(), '@');
                os << (std::isprint(ch) ? ch : '@');
            }*/
			printc(os, i->start());
        }
        else
        {
			printc(os, i->start());
            os << L'-';
			printc(os, (TCHAR)(i->end() - 1));
        }
        i++;
    }
	os << L']';
    return os;
}